

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinition.cpp
# Opt level: O0

bool Shell::FunctionDefinition::occurs(uint f,Term *t)

{
  bool bVar1;
  uint in_EDI;
  TermFunIterator funs;
  uint in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  TermFunIterator *in_stack_ffffffffffffffb8;
  Term *in_stack_ffffffffffffffc8;
  TermFunIterator *in_stack_ffffffffffffffd0;
  bool local_1;
  
  Kernel::TermFunIterator::TermFunIterator(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  do {
    bVar1 = Kernel::TermFunIterator::hasNext(in_stack_ffffffffffffffb8);
    in_stack_ffffffffffffffa4 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffffa4);
    if (!bVar1) {
      local_1 = false;
      goto LAB_00b9d272;
    }
    in_stack_ffffffffffffffa0 =
         Kernel::TermFunIterator::next((TermFunIterator *)&stack0xffffffffffffffb8);
  } while (in_EDI != in_stack_ffffffffffffffa0);
  local_1 = true;
LAB_00b9d272:
  Kernel::TermFunIterator::~TermFunIterator
            ((TermFunIterator *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  return local_1;
}

Assistant:

bool FunctionDefinition::occurs (unsigned f, Term& t)
{
  TermFunIterator funs(&t);
  while (funs.hasNext()) {
    if (f == funs.next()) {
      return true;
    }
  }
  return false;
}